

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper::
RunImpl(initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper *this)

{
  _func_int **pp_Var1;
  Message *pMVar2;
  TestResults *this_00;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  UtcTimeStamp local_1a8;
  UtcTimeStamp time;
  Logon local_178;
  
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_178,8,8,8,0xd,5,0x7df);
  *(ulong *)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
             super_DateTime.m_date =
       CONCAT44(local_178.super_Message._12_4_,local_178.super_Message._8_4_);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = CONCAT44(local_178.super_Message._20_4_,local_178.super_Message._16_4_);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_178,0x10,0x10,0x10,0xd,5,0x898);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = local_178.super_Message._8_4_;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.field_0xc = local_178.super_Message._12_4_;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.m_time = local_178.super_Message._16_4_;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
           super_DateTime.m_time + 4) = local_178.super_Message._20_4_;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  pp_Var1 = (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
            _vptr_Responder;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*pp_Var1[8])(this,1,0,0x1f);
  FIX::UtcTimeStamp::UtcTimeStamp(&time);
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  pMVar2 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  createLogon(&local_178,"ISLD","TW",1);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_1a8);
  FIX::Session::next(pMVar2,(UtcTimeStamp *)&local_178,SUB81(&local_1a8,0));
  FIX::Message::~Message((Message *)&local_178);
  if ((this->super_initiatorFixture).super_sessionFixture.object[0x262] == (Session)0x1) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&local_178,*ppTVar4,0x7d9);
    UnitTest::TestResults::OnTestFailure(this_00,(TestDetails *)&local_178,"!object->sentLogout()");
  }
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOnResponse_ReceivedResponseBeforeSendingLogOnRequest) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  object->logon();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  CHECK(!object->sentLogout());
}